

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int ly_set_merge(ly_set *trg,ly_set *src,int options)

{
  lys_node **__ptr;
  uint uVar1;
  char *format;
  uint uVar2;
  LY_ERR no;
  ulong uVar3;
  ulong uVar4;
  
  if (trg == (ly_set *)0x0) {
    format = "Invalid arguments (%s()).";
    no = LY_EINVAL;
LAB_0016ca51:
    ly_log((ly_ctx *)0x0,LY_LLERR,no,format,"ly_set_merge");
    uVar1 = 0xffffffff;
  }
  else {
    if (src == (ly_set *)0x0) {
      return 0;
    }
    uVar1 = src->number;
    if ((options & 1U) == 0) {
      if (uVar1 == 0) {
        uVar1 = 0;
      }
      else {
        uVar4 = 0;
        do {
          if ((ulong)trg->number != 0) {
            uVar3 = 0;
            do {
              if ((trg->set).s[uVar3] == (src->set).s[uVar4]) {
                if (-1 < (int)uVar3) {
                  ly_set_rm_index(src,(uint)uVar4);
                  uVar1 = src->number;
                  goto LAB_0016ca33;
                }
                break;
              }
              uVar3 = uVar3 + 1;
            } while (trg->number != uVar3);
          }
          uVar4 = (ulong)((uint)uVar4 + 1);
LAB_0016ca33:
        } while ((uint)uVar4 < uVar1);
      }
    }
    uVar2 = trg->number;
    __ptr = (trg->set).s;
    if (trg->size < uVar1 + uVar2) {
      __ptr = (lys_node **)realloc(__ptr,(ulong)(uVar1 + uVar2) << 3);
      if (__ptr == (lys_node **)0x0) {
        format = "Memory allocation failed (%s()).";
        no = LY_EMEM;
        goto LAB_0016ca51;
      }
      uVar2 = trg->number;
      trg->size = src->number + uVar2;
      (trg->set).s = __ptr;
      uVar1 = src->number;
    }
    memcpy(__ptr + uVar2,(src->set).s,(ulong)uVar1 << 3);
    uVar1 = src->number;
    trg->number = trg->number + uVar1;
    free((src->set).s);
    free(src);
  }
  return uVar1;
}

Assistant:

API int
ly_set_merge(struct ly_set *trg, struct ly_set *src, int options)
{
    unsigned int i, ret;
    void **new;

    if (!trg) {
        LOGARG;
        return -1;
    }

    if (!src) {
        return 0;
    }

    if (!(options & LY_SET_OPT_USEASLIST)) {
        /* remove duplicates */
        i = 0;
        while (i < src->number) {
            if (ly_set_contains(trg, src->set.g[i]) > -1) {
                ly_set_rm_index(src, i);
            } else {
                ++i;
            }
        }
    }

    /* allocate more memory if needed */
    if (trg->size < trg->number + src->number) {
        new = realloc(trg->set.g, (trg->number + src->number) * sizeof *(trg->set.g));
        LY_CHECK_ERR_RETURN(!new, LOGMEM(NULL), -1);
        trg->size = trg->number + src->number;
        trg->set.g = new;
    }

    /* copy contents from src into trg */
    memcpy(trg->set.g + trg->number, src->set.g, src->number * sizeof *(src->set.g));
    ret = src->number;
    trg->number += ret;

    /* cleanup */
    ly_set_free(src);
    return ret;
}